

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void integer_suite::test_int16_one(void)

{
  int value;
  value_type input [3];
  undefined4 local_ac;
  iarchive in;
  
  input[2] = '\0';
  input[0] = 0xb2;
  input[1] = '\x01';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>(&in,&input);
  value = 99;
  trial::protocol::bintoken::iarchive::load<int>(&in,&value);
  local_ac = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x7a,"void integer_suite::test_int16_one()",&value,&local_ac);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_int16_one()
{
    const value_type input[] = { token::code::int16, 0x01, 0x00 };
    format::iarchive in(input);
    int value = 99;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, 1);
}